

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O2

VertexAlignment *
s2polyline_alignment::GetExactVertexAlignment
          (VertexAlignment *__return_storage_ptr__,S2Polyline *a,S2Polyline *b)

{
  ostream *poVar1;
  allocator_type local_59;
  Window w;
  _Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  local_38;
  value_type local_20;
  
  if ((long)a->num_vertices_ < 1) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&w,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x11b,kFatal,(ostream *)&std::cerr);
    poVar1 = std::operator<<((ostream *)
                             w.strides_.
                             super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                             ._M_impl.super__Vector_impl_data._M_start,"Check failed: a_n > 0 ");
    std::operator<<(poVar1,"A is empty polyline.");
  }
  else {
    local_20.end = b->num_vertices_;
    if (0 < local_20.end) {
      local_20.start = 0;
      std::
      vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
      ::vector((vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                *)&local_38,(long)a->num_vertices_,&local_20,&local_59);
      Window::Window(&w,(vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                         *)&local_38);
      std::
      _Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
      ::~_Vector_base(&local_38);
      DynamicTimewarp(__return_storage_ptr__,a,b,&w);
      std::
      _Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
      ::~_Vector_base(&w.strides_.
                       super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                     );
      return __return_storage_ptr__;
    }
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&w,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
               ,0x11c,kFatal,(ostream *)&std::cerr);
    poVar1 = std::operator<<((ostream *)
                             w.strides_.
                             super__Vector_base<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                             ._M_impl.super__Vector_impl_data._M_start,"Check failed: b_n > 0 ");
    std::operator<<(poVar1,"B is empty polyline.");
  }
  abort();
}

Assistant:

VertexAlignment GetExactVertexAlignment(const S2Polyline& a,
                                        const S2Polyline& b) {
  const int a_n = a.num_vertices();
  const int b_n = b.num_vertices();
  S2_CHECK(a_n > 0) << "A is empty polyline.";
  S2_CHECK(b_n > 0) << "B is empty polyline.";
  const auto w = Window(std::vector<ColumnStride>(a_n, {0, b_n}));
  return DynamicTimewarp(a, b, w);
}